

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int ARKodeSetNoInactiveRootWarn(void *arkode_mem)

{
  int line;
  
  if (arkode_mem == (void *)0x0) {
    arkode_mem = (ARKodeMem)0x0;
    line = 0x5c1;
  }
  else {
    if (*(long *)((long)arkode_mem + 0x3d8) != 0) {
      *(undefined4 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x78) = 0;
      return 0;
    }
    line = 0x5c8;
  }
  arkProcessError((ARKodeMem)arkode_mem,-0x15,line,"ARKodeSetNoInactiveRootWarn",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                  ,"arkode_mem = NULL illegal.");
  return -0x15;
}

Assistant:

int ARKodeSetNoInactiveRootWarn(void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  if (ark_mem->root_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_root_mem          = (ARKodeRootMem)ark_mem->root_mem;
  ark_root_mem->mxgnull = 0;
  return (ARK_SUCCESS);
}